

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

double amrex::InvNormDistBest(double p)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if ((p <= 0.0) || (1.0 <= p)) {
    Error_host("InvNormDistBest(): p MUST be in (0,1)");
  }
  dVar5 = p + -0.5;
  if (ABS(dVar5) <= 0.425) {
    dVar4 = 0.180625 - dVar5 * dVar5;
    dVar2 = 0.0;
    dVar3 = 0.0;
    for (uVar1 = 7; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
      dVar2 = dVar2 * dVar4 + InvNormDistBest::a[uVar1];
      dVar3 = dVar3 * dVar4 + InvNormDistBest::b[uVar1];
    }
    dVar3 = (dVar5 * dVar2) / dVar3;
  }
  else {
    dVar2 = log((double)(-(ulong)(dVar5 < 0.0) & (ulong)p |
                        ~-(ulong)(dVar5 < 0.0) & (ulong)(1.0 - p)));
    if (-0.0 < dVar2) {
      dVar2 = sqrt(-dVar2);
    }
    else {
      dVar2 = SQRT(-dVar2);
    }
    if (dVar2 <= 5.0) {
      dVar3 = 0.0;
      dVar4 = 0.0;
      for (uVar1 = 7; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
        dVar3 = dVar3 * (dVar2 + -1.6) + InvNormDistBest::c[uVar1];
        dVar4 = dVar4 * (dVar2 + -1.6) + InvNormDistBest::d[uVar1];
      }
    }
    else {
      dVar3 = 0.0;
      dVar4 = 0.0;
      for (uVar1 = 7; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
        dVar3 = dVar3 * (dVar2 + -5.0) + InvNormDistBest::e[uVar1];
        dVar4 = dVar4 * (dVar2 + -5.0) + InvNormDistBest::f[uVar1];
      }
    }
    dVar3 = dVar3 / dVar4;
    if (dVar5 < 0.0) {
      dVar3 = -dVar3;
    }
  }
  return dVar3;
}

Assistant:

double
amrex::InvNormDistBest (double p)

{
  static const double a[8] =
  {
      3.3871328727963666080,     1.3314166789178437745e+2,
      1.9715909503065514427e+3,  1.3731693765509461125e+4,
      4.5921953931549871457e+4,  6.7265770927008700853e+4,
      3.3430575583588128105e+4,  2.5090809287301226727e+3
  };
  static const double b[8] =
  {
      1.0,                       4.2313330701600911252e+1,
      6.8718700749205790830e+2,  5.3941960214247511077e+3,
      2.1213794301586595867e+4,  3.9307895800092710610e+4,
      2.8729085735721942674e+4,  5.2264952788528545610e+3
  };
  static const double c[8] =
  {
      1.42343711074968357734,     4.63033784615654529590,
      5.76949722146069140550,     3.64784832476320460504,
      1.27045825245236838258,     2.41780725177450611770e-1,
      2.27238449892691845833e-2,  7.74545014278341407640e-4
  };

  static const double d[8] =
  {
      1.0,                        2.05319162663775882187,
      1.67638483018380384940,     6.89767334985100004550e-1,
      1.48103976427480074590e-1,  1.51986665636164571966e-2,
      5.47593808499534494600e-4,  1.05075007164441684324e-9
  };
  static const double e[8] =
  {
      6.65790464350110377720,     5.46378491116411436990,
      1.78482653991729133580,     2.96560571828504891230e-1,
      2.65321895265761230930e-2,  1.24266094738807843860e-3,
      2.71155556874348757815e-5,  2.01033439929228813265e-7
  };
  static const double f[8] =
  {
      1.0,                        5.99832206555887937690e-1,
      1.36929880922735805310e-1,  1.48753612908506148525e-2,
      7.86869131145613259100e-4,  1.84631831751005468180e-5,
      1.42151175831644588870e-7,  2.04426310338993978564e-15
  };

  static const double CONST1 = 0.180625;
  static const double CONST2 = 1.6;
  static const double SPLIT1 = 0.425;
  static const double SPLIT2 = 5.0;

  double r, value;

  if (p <= 0 || p >= 1)
      amrex::Error("InvNormDistBest(): p MUST be in (0,1)");

  double q = p - 0.5;

  if ( std::fabs ( q ) <= SPLIT1 )
  {
      r = CONST1 - q * q;

      double num = 0.0, den = 0.0;

      for (int i = 7; 0 <= i; i-- )
      {
          num = num * r + a[i];
          den = den * r + b[i];
      }

      value = q * num / den;
  }
  else
  {
      r = ( ( q < 0.0 ) ? p : (1.0 - p) );

      r = std::sqrt ( -std::log ( r ) );

      if ( r <= SPLIT2 )
      {
          r = r - CONST2;

          double num = 0.0, den = 0.0;

          for (int i = 7; 0 <= i; i-- )
          {
              num = num * r + c[i];
              den = den * r + d[i];
          }

          value = num / den;
      }
      else
      {
          r = r - SPLIT2;

          double num = 0.0, den = 0.0;

          for (int i = 7; 0 <= i; i-- )
          {
              num = num * r + e[i];
              den = den * r + f[i];
          }

          value = num / den;
      }

      if ( q < 0.0 ) value = -value;
  }

  return value;
}